

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O3

void slang::detail::hashing::HashValueImpl<std::tuple<slang::DiagCode,_slang::SourceLocation>,_1UL>
     ::apply(size_t *seed,tuple<slang::DiagCode,_slang::SourceLocation> *tuple)

{
  SourceLocation SVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = *seed;
  uVar3 = (uVar3 >> 2) + uVar3 * 0x40 +
          ((ulong)(tuple->super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>).
                  super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl.code |
          (ulong)(uint)((int)(tuple->super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>)
                             .super__Head_base<0UL,_slang::DiagCode,_false>._M_head_impl << 0x10)) +
          0x9e3779b9 ^ uVar3;
  *seed = uVar3;
  SVar1 = (tuple->super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>).
          super__Tuple_impl<1UL,_slang::SourceLocation>.
          super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl;
  uVar4 = (ulong)(SVar1._0_4_ & 0xfffffff) + 0x9e3779b9;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (ulong)SVar1 >> 0x1c;
  *seed = (uVar3 >> 2) + uVar3 * 0x40 + 0x9e3779b9 +
          ((uVar4 >> 2 & 0x3fffffff) + uVar4 * 0x40 + 0x9e3779b9 +
           (SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar4) ^ uVar3;
  return;
}

Assistant:

size_t operator()(const slang::DiagCode& dc) const {
        return (((size_t)dc.getSubsystem()) << 16) | dc.getCode();
    }